

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint getNumColorChannels(LodePNGColorType colortype)

{
  LodePNGColorType colortype_local;
  uint local_4;
  
  switch(colortype) {
  case LCT_GREY:
    local_4 = 1;
    break;
  default:
    local_4 = 0;
    break;
  case LCT_RGB:
    local_4 = 3;
    break;
  case LCT_PALETTE:
    local_4 = 1;
    break;
  case LCT_GREY_ALPHA:
    local_4 = 2;
    break;
  case LCT_RGBA:
    local_4 = 4;
  }
  return local_4;
}

Assistant:

static unsigned getNumColorChannels(LodePNGColorType colortype)
{
  switch(colortype)
  {
    case 0: return 1; /*grey*/
    case 2: return 3; /*RGB*/
    case 3: return 1; /*palette*/
    case 4: return 2; /*grey + alpha*/
    case 6: return 4; /*RGBA*/
  }
  return 0; /*unexisting color type*/
}